

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

FunctionData ** __thiscall
DirectChainedMap<FunctionData_*>::find(DirectChainedMap<FunctionData_*> *this,uint hash)

{
  Node *pNVar1;
  Node *local_38;
  Node *curr;
  Node *start;
  uint bucket;
  uint bucketMask;
  uint hash_local;
  DirectChainedMap<FunctionData_*> *this_local;
  
  pNVar1 = this->data + (ulong)(hash & this->bucketCount - 1) * 0x18;
  local_38 = pNVar1;
  if (*(long *)(pNVar1 + 0x10) != 0) {
    do {
      if (local_38 == (Node *)0x0) {
        return (FunctionData **)0x0;
      }
      if (*(uint *)local_38 == hash) {
        return (FunctionData **)(local_38 + 8);
      }
      local_38 = *(Node **)(local_38 + 0x10);
    } while (local_38 != pNVar1);
  }
  return (FunctionData **)0x0;
}

Assistant:

Value* find(unsigned hash)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *start = &data[bucket];
		Node *curr = start;

		if(!curr->next)
			return NULL;

		while(curr)
		{
			if(curr->hash == hash)
				return &curr->value;

			curr = curr->next;

			if(curr == start)
				return NULL;
		}

		return NULL;
	}